

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<phmap::priv::hash_internal::EnumClass_const&>::
GetDescriberImpl<testing::internal::MatcherBase<phmap::priv::hash_internal::EnumClass_const&>::ValuePolicy<testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>,true>>
          (MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<const_EnumClass_&>_*,_const_EqMatcher<EnumClass>_*>_>
  *ppMVar1;
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> *local_28;
  tuple<const_testing::internal::MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>_*,_const_testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>_*>
  local_20;
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> *local_10;
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::
  ValuePolicy<testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<phmap::priv::hash_internal::EnumClass_const&>const*,testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>const*>
            ((MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> **)&local_20,
             (EqMatcher<phmap::priv::hash_internal::EnumClass> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<phmap::priv::hash_internal::EnumClass_const&>const*,testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }